

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

string * __thiscall
t_swift_generator::enum_const_name
          (string *__return_storage_ptr__,t_swift_generator *this,string *enum_identifier)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  
  pcVar6 = (enum_identifier->_M_dataplus)._M_p;
  pcVar2 = pcVar6 + enum_identifier->_M_string_length;
  if (0 < (long)enum_identifier->_M_string_length) {
    do {
      if (*pcVar6 == '.') break;
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 < pcVar2);
  }
  for (; pcVar6 != pcVar2; pcVar6 = pcVar6 + 1) {
    iVar5 = tolower((int)*pcVar6);
    *pcVar6 = (char)iVar5;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (enum_identifier->_M_dataplus)._M_p;
  paVar1 = &enum_identifier->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&enum_identifier->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = enum_identifier->_M_string_length;
  (enum_identifier->_M_dataplus)._M_p = (pointer)paVar1;
  enum_identifier->_M_string_length = 0;
  (enum_identifier->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::enum_const_name(string enum_identifier) {
  string::iterator it;
  for (it = enum_identifier.begin(); it < enum_identifier.end(); ++it) {
    if ((*it) == '.') {
      break;
    }
  }
  std::transform(it, enum_identifier.end(), it, ::tolower);
  return enum_identifier;
}